

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

void __thiscall leveldb::DBImpl::RecordBackgroundError(DBImpl *this,Status *s)

{
  if ((this->bg_error_).state_ != (char *)0x0) {
    return;
  }
  Status::operator=(&this->bg_error_,s);
  std::condition_variable::notify_all();
  return;
}

Assistant:

bool ok() const { return (state_ == nullptr); }